

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3Realloc(void *pOld,u64 nBytes)

{
  int iVar1;
  int iVar2;
  int nByte;
  int iVar3;
  sqlite3_int64 sVar4;
  void *local_38;
  void *pNew;
  int nDiff;
  int nNew;
  int nOld;
  u64 nBytes_local;
  void *pOld_local;
  
  if (pOld == (void *)0x0) {
    pOld_local = sqlite3Malloc(nBytes);
  }
  else if (nBytes == 0) {
    sqlite3_free(pOld);
    pOld_local = (void *)0x0;
  }
  else if (nBytes < 0x7fffff00) {
    iVar1 = sqlite3MallocSize(pOld);
    iVar3 = (int)nBytes;
    iVar2 = (*sqlite3Config.m.xRoundup)(iVar3);
    local_38 = pOld;
    if (iVar1 != iVar2) {
      if (sqlite3Config.bMemstat == 0) {
        local_38 = (*sqlite3Config.m.xRealloc)(pOld,iVar2);
      }
      else {
        sqlite3_mutex_enter(mem0.mutex);
        sqlite3StatusHighwater(5,iVar3);
        nByte = iVar2 - iVar1;
        if ((0 < nByte) && (sVar4 = sqlite3StatusValue(0), mem0.alarmThreshold - nByte <= sVar4)) {
          sqlite3MallocAlarm(nByte);
        }
        local_38 = (*sqlite3Config.m.xRealloc)(pOld,iVar2);
        if ((local_38 == (void *)0x0) && (0 < mem0.alarmThreshold)) {
          sqlite3MallocAlarm(iVar3);
          local_38 = (*sqlite3Config.m.xRealloc)(pOld,iVar2);
        }
        if (local_38 != (void *)0x0) {
          iVar3 = sqlite3MallocSize(local_38);
          sqlite3StatusUp(0,iVar3 - iVar1);
        }
        sqlite3_mutex_leave(mem0.mutex);
      }
    }
    pOld_local = local_38;
  }
  else {
    pOld_local = (void *)0x0;
  }
  return pOld_local;
}

Assistant:

SQLITE_PRIVATE void *sqlite3Realloc(void *pOld, u64 nBytes){
  int nOld, nNew, nDiff;
  void *pNew;
  assert( sqlite3MemdebugHasType(pOld, MEMTYPE_HEAP) );
  assert( sqlite3MemdebugNoType(pOld, (u8)~MEMTYPE_HEAP) );
  if( pOld==0 ){
    return sqlite3Malloc(nBytes); /* IMP: R-04300-56712 */
  }
  if( nBytes==0 ){
    sqlite3_free(pOld); /* IMP: R-26507-47431 */
    return 0;
  }
  if( nBytes>=0x7fffff00 ){
    /* The 0x7ffff00 limit term is explained in comments on sqlite3Malloc() */
    return 0;
  }
  nOld = sqlite3MallocSize(pOld);
  /* IMPLEMENTATION-OF: R-46199-30249 SQLite guarantees that the second
  ** argument to xRealloc is always a value returned by a prior call to
  ** xRoundup. */
  nNew = sqlite3GlobalConfig.m.xRoundup((int)nBytes);
  if( nOld==nNew ){
    pNew = pOld;
  }else if( sqlite3GlobalConfig.bMemstat ){
    sqlite3_mutex_enter(mem0.mutex);
    sqlite3StatusHighwater(SQLITE_STATUS_MALLOC_SIZE, (int)nBytes);
    nDiff = nNew - nOld;
    if( nDiff>0 && sqlite3StatusValue(SQLITE_STATUS_MEMORY_USED) >= 
          mem0.alarmThreshold-nDiff ){
      sqlite3MallocAlarm(nDiff);
    }
    pNew = sqlite3GlobalConfig.m.xRealloc(pOld, nNew);
    if( pNew==0 && mem0.alarmThreshold>0 ){
      sqlite3MallocAlarm((int)nBytes);
      pNew = sqlite3GlobalConfig.m.xRealloc(pOld, nNew);
    }
    if( pNew ){
      nNew = sqlite3MallocSize(pNew);
      sqlite3StatusUp(SQLITE_STATUS_MEMORY_USED, nNew-nOld);
    }
    sqlite3_mutex_leave(mem0.mutex);
  }else{
    pNew = sqlite3GlobalConfig.m.xRealloc(pOld, nNew);
  }
  assert( EIGHT_BYTE_ALIGNMENT(pNew) ); /* IMP: R-11148-40995 */
  return pNew;
}